

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void * handle_accept(void *arg)

{
  int fd;
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  iterator iVar6;
  mapped_type *this;
  size_t sVar7;
  CharContent *pCVar8;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  size_t local_e48;
  CharContent res_content_3;
  epoll_event event_ret;
  size_t all;
  size_t local_e00;
  Epoll e;
  CharContent ret_request;
  HttpResponse http_response;
  CharContent local_d80;
  CharContent local_d58;
  CharContent local_d30;
  CharContent local_d08;
  CharContent local_ce0;
  CharContent local_cb8;
  CharContent local_c90;
  CharContent local_c68;
  CharContent local_c40;
  source server_resource;
  Request request;
  CharContent res;
  HttpRequest http_parser;
  Response response;
  Request local_510;
  char buf [1024];
  
  fd = *arg;
  operator_delete(arg);
  Request::Request(&request);
  Response::Response(&response);
  HttpResponse::HttpResponse(&http_response);
  e._vptr_Epoll = (_func_int **)&PTR__Epoll_00117c48;
  e.epoll_fd = epoll_create(1);
  Epoll::make_ctl(&e,1,fd,1);
  iVar3 = e.epoll_fd;
  CharContent::CharContent(&ret_request);
  memset(buf,0,0x400);
  local_e48 = 0xffffffffffffffff;
  do {
    do {
      uVar2 = epoll_wait(iVar3,(epoll_event *)&event_ret,1,15000);
      if ((int)uVar2 < 1) goto LAB_0010e386;
    } while ((event_ret.data.fd != fd) || (((byte)event_ret.events & 1) == 0));
    local_e48 = read(fd,buf,0x400);
    if ((long)local_e48 < 1) break;
    CharContent::append(&ret_request,buf,local_e48);
    memset(buf,0,0x400);
    CharContent::CharContent(&res,"\r\n\r\n");
    sVar4 = CharContent::find(&ret_request,&res,0);
    local_e00 = ret_request.npos;
    CharContent::~CharContent(&res);
  } while (sVar4 == local_e00);
LAB_0010e386:
  pcVar5 = CharContent::c_str(&ret_request);
  sVar4 = CharContent::length(&ret_request);
  write(1,pcVar5,sVar4);
  if ((int)uVar2 < 0) {
    CharContent::CharContent(&local_c40,"500");
    HttpResponse::response_content((CharContent *)&server_resource,&http_response,&local_c40);
    CharContent::~CharContent(&local_c40);
    memset(&res,0,200);
    snprintf((char *)&res,200,"ret_num %d\n",(ulong)uVar2);
    log(__x);
    response_to_client((CharContent *)&server_resource,fd);
  }
  else {
    if (-1 < (long)local_e48) {
      CharContent::CharContent(&local_c90,&ret_request);
      HttpRequest::HttpRequest(&http_parser,&local_c90);
      CharContent::~CharContent(&local_c90);
      bVar1 = HttpRequest::handle_request(&http_parser,&request);
      if (bVar1) {
        CharContent::CharContent(&res,"Content-Length");
        iVar6 = std::
                _Hashtable<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&request.headers._M_h,&res);
        CharContent::~CharContent(&res);
        if (iVar6.super__Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true>._M_cur
            != (__node_type *)0x0) {
          all = 0;
          CharContent::CharContent(&res,"Content-Length");
          this = std::__detail::
                 _Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&request.headers,&res);
          pcVar5 = CharContent::c_str(this);
          local_e48 = 0;
          __isoc99_sscanf(pcVar5,"%lu",&all);
          CharContent::~CharContent(&res);
          memset(&res,0,0x400);
          uVar2 = 0xffffffff;
          while( true ) {
            sVar4 = all;
            sVar7 = CharContent::length(&request.Entity);
            if (sVar4 <= sVar7) break;
            uVar2 = epoll_wait(iVar3,(epoll_event *)&event_ret,1,20000);
            if ((int)uVar2 < 1) break;
            if ((event_ret.data.fd == fd) && (((byte)event_ret.events & 1) != 0)) {
              local_e48 = read(fd,&res,0x400);
              if ((long)local_e48 < 1) goto LAB_0010e72e;
              CharContent::append(&request.Entity,(char *)&res,local_e48);
              memset(&res,0,0x400);
            }
          }
          if ((int)uVar2 < 0) {
            CharContent::CharContent(&local_ce0,"500");
            HttpResponse::response_content(&res_content_3,&http_response,&local_ce0);
            CharContent::~CharContent(&local_ce0);
            memset(&server_resource,0,200);
            snprintf((char *)&server_resource,200,"epoll_ret_num %d\n",(ulong)uVar2);
            log(__x_03);
            response_to_client(&res_content_3,fd);
          }
          else {
LAB_0010e72e:
            if (-1 < (long)local_e48) goto LAB_0010e73b;
            CharContent::CharContent(&local_d08,"500");
            HttpResponse::response_content(&res_content_3,&http_response,&local_d08);
            CharContent::~CharContent(&local_d08);
            memset(&server_resource,0,200);
            snprintf((char *)&server_resource,200,"entity_read_size %lu\n",local_e48);
            log(__x_06);
            response_to_client(&res_content_3,fd);
          }
          pCVar8 = &res_content_3;
          goto LAB_0010ea9e;
        }
LAB_0010e73b:
        Epoll::make_ctl(&e,2,fd,1);
        source::source(&server_resource,fd);
        Request::Request(&local_510,&request);
        iVar3 = source::resource_find(&server_resource,&local_510,&response);
        Request::~Request(&local_510);
        if (iVar3 == 3) {
          CharContent::CharContent(&local_d80,"500");
          HttpResponse::response_content(&res_content_3,&http_response,&local_d80);
          CharContent::~CharContent(&local_d80);
          memset(&res,0,200);
          snprintf((char *)&res,200,"resource_find_ret %d\n",3);
          log(__x_05);
          response_to_client(&res_content_3,fd);
LAB_0010e9c0:
          pCVar8 = &res_content_3;
        }
        else {
          if (iVar3 == 2) {
            CharContent::CharContent(&local_d58,"400");
            HttpResponse::response_content(&res_content_3,&http_response,&local_d58);
            CharContent::~CharContent(&local_d58);
            memset(&res,0,200);
            snprintf((char *)&res,200,"resource_find_ret %d\n",2);
            log(__x_04);
            response_to_client(&res_content_3,fd);
            goto LAB_0010e9c0;
          }
          if (iVar3 == 1) {
            CharContent::CharContent(&local_d30,"404");
            HttpResponse::response_content(&res_content_3,&http_response,&local_d30);
            CharContent::~CharContent(&local_d30);
            memset(&res,0,200);
            snprintf((char *)&res,200,"resource_find_ret %d\n",1);
            log(__x_02);
            response_to_client(&res_content_3,fd);
            goto LAB_0010e9c0;
          }
          HttpResponse::response_content(&res,&http_response,&response,&request);
          response_to_client(&res,fd);
          pCVar8 = &res;
        }
        CharContent::~CharContent(pCVar8);
        source::~source(&server_resource);
      }
      else {
        CharContent::CharContent(&local_cb8,"400");
        HttpResponse::response_content((CharContent *)&server_resource,&http_response,&local_cb8);
        CharContent::~CharContent(&local_cb8);
        memset((void *)((long)&res.npos + 5),0,0xbb);
        res._vptr_CharContent._0_5_ = 0x5f70747468;
        res._vptr_CharContent._5_3_ = 0x726170;
        res.npos._0_5_ = 0xa726573;
        log(__x_01);
        response_to_client((CharContent *)&server_resource,fd);
        pCVar8 = (CharContent *)&server_resource;
LAB_0010ea9e:
        CharContent::~CharContent(pCVar8);
      }
      HttpRequest::~HttpRequest(&http_parser);
      goto LAB_0010eab0;
    }
    CharContent::CharContent(&local_c68,"500");
    HttpResponse::response_content((CharContent *)&server_resource,&http_response,&local_c68);
    CharContent::~CharContent(&local_c68);
    memset(&res,0,200);
    snprintf((char *)&res,200,"read_size %lu\n",local_e48);
    log(__x_00);
    response_to_client((CharContent *)&server_resource,fd);
  }
  CharContent::~CharContent((CharContent *)&server_resource);
LAB_0010eab0:
  CharContent::~CharContent(&ret_request);
  Epoll::~Epoll(&e);
  HttpResponse::~HttpResponse(&http_response);
  Response::~Response(&response);
  Request::~Request(&request);
  return (void *)0x0;
}

Assistant:

void *handle_accept(void *arg){
    int *ptr=(int *)arg;
    int connfd=*ptr;
    delete ptr;

    Request request;
    Response response;
    HttpResponse http_response;


    Epoll e(1);
    e.make_ctl(EPOLL_CTL_ADD,connfd,EPOLLIN);
    int epoll_fd=e.get_epoll_fd();
    epoll_event event_ret;
    int ret_num=-1;
    ssize_t read_size=-1;
    CharContent ret_request;
    char buf[1024]={'\0'};
    while(true){
        ret_num=epoll_wait(epoll_fd,&event_ret,1,15000);
        if(ret_num<1){
            break;
        }
        int ret_fd=event_ret.data.fd;
        if(ret_fd==connfd&&(event_ret.events&EPOLLIN)){
            read_size=read(connfd,buf,sizeof(buf));
            if(read_size<=0){
                break;
            }
            ret_request.append(buf,read_size);
            memset(buf,'\0',sizeof(buf));
            if(ret_request.find(CharContent("\r\n\r\n"))!=ret_request.npos){
                break;
            }
        }
    }
    write(STDOUT_FILENO,ret_request.c_str(),ret_request.length());
    if(ret_num<0){
        CharContent res_content(http_response.response_content(CharContent("500")));
        char v_log[200]={'\0'};
        snprintf(v_log,sizeof(v_log),"ret_num %d\n",ret_num);
        log(v_log);
        return response_to_client(res_content,connfd);
    }
    if(read_size<0){
        CharContent res_content(http_response.response_content(CharContent("500")));
        char v_log[200]={'\0'};
        snprintf(v_log,sizeof(v_log),"read_size %lu\n",read_size);
        log(v_log);
        return response_to_client(res_content,connfd);
    }
    HttpRequest http_parser(ret_request);
    if(!http_parser.handle_request(&request)){
        CharContent res_content(http_response.response_content(CharContent("400")));
        char v_log[200]={'\0'};
        snprintf(v_log,sizeof(v_log),"http_parser\n");
        log(v_log);
        return response_to_client(res_content,connfd);
    }
    if(request.headers.find(CharContent("Content-Length"))!=request.headers.end()){
        size_t all=0;
        sscanf(request.headers["Content-Length"].c_str(),"%lu",&all);
        int epoll_ret_num=-1;
        ssize_t entity_read_size=0;
        char entity_buf[1024]={'\0'};
        while(true){
            if(all<=request.Entity.length()){
                break;
            }
            epoll_ret_num=epoll_wait(epoll_fd,&event_ret,1,20000);
            if(epoll_ret_num<1){
                break;
            }
            int ret_fd=event_ret.data.fd;
            if(ret_fd==connfd&&(event_ret.events&EPOLLIN)){
                entity_read_size=read(connfd,entity_buf,sizeof(entity_buf));
                if(entity_read_size<=0){
                    break;
                }
                request.Entity.append(entity_buf,entity_read_size);
                memset(entity_buf,'\0',sizeof(entity_buf));
            }
        }
        if(epoll_ret_num<0){
            CharContent res_content(http_response.response_content(CharContent("500")));
            char v_log[200]={'\0'};
            snprintf(v_log,sizeof(v_log),"epoll_ret_num %d\n",epoll_ret_num);
            log(v_log);
            return response_to_client(res_content,connfd);
        }
        if(entity_read_size<0){
            CharContent res_content(http_response.response_content(CharContent("500")));
            char v_log[200]={'\0'};
            snprintf(v_log,sizeof(v_log),"entity_read_size %lu\n",entity_read_size);
            log(v_log);
            return response_to_client(res_content,connfd);
        }
    }
    e.make_ctl(EPOLL_CTL_DEL,connfd,EPOLLIN);
    source server_resource(connfd);
    int resource_find_ret=server_resource.resource_find(request,&response);
    /*
     * 0 ok
     * 1 not find resource
     * 2 file type unknow(not file or document)
     * 3 exec error
     */
    if(resource_find_ret==1){
        CharContent res_content(http_response.response_content(CharContent("404")));
        char v_log[200]={'\0'};
        snprintf(v_log,sizeof(v_log),"resource_find_ret %d\n",resource_find_ret);
        log(v_log);
        return response_to_client(res_content,connfd);
    }
    if(resource_find_ret==2){
        CharContent res_content(http_response.response_content(CharContent("400")));
        char v_log[200]={'\0'};
        snprintf(v_log,sizeof(v_log),"resource_find_ret %d\n",resource_find_ret);
        log(v_log);
        return response_to_client(res_content,connfd);
    }
    if(resource_find_ret==3){
        CharContent res_content(http_response.response_content(CharContent("500")));
        char v_log[200]={'\0'};
        snprintf(v_log,sizeof(v_log),"resource_find_ret %d\n",resource_find_ret);
        log(v_log);
        return response_to_client(res_content,connfd);
    }
    CharContent res(http_response.response_content(&response,&request));
    return response_to_client(res,connfd);
}